

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_get_resource_type(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((0 < nArg) && (iVar1 = jx9_value_is_resource(*apArg), iVar1 != 0)) {
    jx9_result_string_format(pCtx,"resID_%#x",((*apArg)->x).rVal);
    return 0;
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int vm_builtin_get_resource_type(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE*/
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	jx9_result_string_format(pCtx, "resID_%#x", apArg[0]->x.pOther);
	return SXRET_OK;
}